

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare_statement.cpp
# Opt level: O3

string * __thiscall
duckdb::PrepareStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,PrepareStatement *this)

{
  pointer pSVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_4ed193b + 9);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->name)._M_dataplus._M_p);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pSVar1 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->(&this->statement);
  (*pSVar1->_vptr_SQLStatement[2])(local_38,pSVar1);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string PrepareStatement::ToString() const {
	string result = "";
	result += "PREPARE";
	result += " ";
	result += name;
	result += " ";
	result += "AS";
	result += " ";
	result += statement->ToString();
	// NOTE: We expect SQLStatement->ToString() to always end in a ';' ^
	return result;
}